

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

deUint32 glu::getInternalFormat(TextureFormat texFormat)

{
  InternalError *this;
  allocator<char> local_39;
  string local_38;
  TextureFormat local_14;
  TextureFormat texFormat_local;
  
  local_14.order = texFormat.order;
  local_14.type = texFormat.type;
  local_14.type = local_14.order << 0x10 | local_14.type;
  if (local_14.type == SNORM_INT8) {
    texFormat_local.order = 0x8f94;
  }
  else if (local_14.type == SNORM_INT16) {
    texFormat_local.order = 0x8f98;
  }
  else if (local_14.type == UNORM_INT8) {
    texFormat_local.order = 0x8229;
  }
  else if (local_14.type == UNORM_INT16) {
    texFormat_local.order = 0x822a;
  }
  else if (local_14.type == SIGNED_INT8) {
    texFormat_local.order = 0x8231;
  }
  else if (local_14.type == SIGNED_INT16) {
    texFormat_local.order = 0x8233;
  }
  else if (local_14.type == SIGNED_INT32) {
    texFormat_local.order = 0x8235;
  }
  else if (local_14.type == UNSIGNED_INT8) {
    texFormat_local.order = 0x8232;
  }
  else if (local_14.type == UNSIGNED_INT16) {
    texFormat_local.order = 0x8234;
  }
  else if (local_14.type == UNSIGNED_INT32) {
    texFormat_local.order = 0x8236;
  }
  else if (local_14.type == HALF_FLOAT) {
    texFormat_local.order = 0x822d;
  }
  else if (local_14.type == FLOAT) {
    texFormat_local.order = 0x822e;
  }
  else if (local_14.type == 0x50000) {
    texFormat_local.order = 0x8f95;
  }
  else if (local_14.type == 0x50001) {
    texFormat_local.order = 0x8f99;
  }
  else if (local_14.type == 0x50003) {
    texFormat_local.order = 0x822b;
  }
  else if (local_14.type == 0x50004) {
    texFormat_local.order = 0x822c;
  }
  else if (local_14.type == 0x5001b) {
    texFormat_local.order = 0x8237;
  }
  else if (local_14.type == 0x5001c) {
    texFormat_local.order = 0x8239;
  }
  else if (local_14.type == 0x5001d) {
    texFormat_local.order = 0x823b;
  }
  else if (local_14.type == 0x5001e) {
    texFormat_local.order = 0x8238;
  }
  else if (local_14.type == 0x5001f) {
    texFormat_local.order = 0x823a;
  }
  else if (local_14.type == 0x50021) {
    texFormat_local.order = 0x823c;
  }
  else if (local_14.type == 0x50022) {
    texFormat_local.order = 0x822f;
  }
  else if (local_14.type == 0x50023) {
    texFormat_local.order = 0x8230;
  }
  else if (local_14.type == 0x70000) {
    texFormat_local.order = 0x8f96;
  }
  else if (local_14.type == 0x70001) {
    texFormat_local.order = 0x8f9a;
  }
  else if (local_14.type == 0x70003) {
    texFormat_local.order = 0x8051;
  }
  else if (local_14.type == 0x70004) {
    texFormat_local.order = 0x8054;
  }
  else if (local_14.type == 0x70008) {
    texFormat_local.order = 0x8d62;
  }
  else if (local_14.type == 0x7000f) {
    texFormat_local.order = 0x8052;
  }
  else if (local_14.type == 0x70016) {
    texFormat_local.order = 0x8c3a;
  }
  else if (local_14.type == 0x70017) {
    texFormat_local.order = 0x8c3d;
  }
  else if (local_14.type == 0x7001b) {
    texFormat_local.order = 0x8d8f;
  }
  else if (local_14.type == 0x7001c) {
    texFormat_local.order = 0x8d89;
  }
  else if (local_14.type == 0x7001d) {
    texFormat_local.order = 0x8d83;
  }
  else if (local_14.type == 0x7001e) {
    texFormat_local.order = 0x8d7d;
  }
  else if (local_14.type == 0x7001f) {
    texFormat_local.order = 0x8d77;
  }
  else if (local_14.type == 0x70021) {
    texFormat_local.order = 0x8d71;
  }
  else if (local_14.type == 0x70022) {
    texFormat_local.order = 0x881b;
  }
  else if (local_14.type == 0x70023) {
    texFormat_local.order = 0x8815;
  }
  else if (local_14.type == 0x80000) {
    texFormat_local.order = 0x8f97;
  }
  else if (local_14.type == 0x80001) {
    texFormat_local.order = 0x8f9b;
  }
  else if (local_14.type == 0x80003) {
    texFormat_local.order = 0x8058;
  }
  else if (local_14.type == 0x80004) {
    texFormat_local.order = 0x805b;
  }
  else if (local_14.type == 0x8000a) {
    texFormat_local.order = 0x8056;
  }
  else if (local_14.type == 0x8000b) {
    texFormat_local.order = 0x8057;
  }
  else if (local_14.type == 0x8000f) {
    texFormat_local.order = 0x8059;
  }
  else if (local_14.type == 0x80015) {
    texFormat_local.order = 0x906f;
  }
  else if (local_14.type == 0x8001b) {
    texFormat_local.order = 0x8d8e;
  }
  else if (local_14.type == 0x8001c) {
    texFormat_local.order = 0x8d88;
  }
  else if (local_14.type == 0x8001d) {
    texFormat_local.order = 0x8d82;
  }
  else if (local_14.type == 0x8001e) {
    texFormat_local.order = 0x8d7c;
  }
  else if (local_14.type == 0x8001f) {
    texFormat_local.order = 0x8d76;
  }
  else if (local_14.type == 0x80021) {
    texFormat_local.order = 0x8d70;
  }
  else if (local_14.type == 0x80022) {
    texFormat_local.order = 0x881a;
  }
  else if (local_14.type == 0x80023) {
    texFormat_local.order = 0x8814;
  }
  else if (local_14.type == 0xc0003) {
    texFormat_local.order = 0x8fbd;
  }
  else if (local_14.type == 0xd0003) {
    texFormat_local.order = 0x8fbe;
  }
  else if (local_14.type == 0xe0003) {
    texFormat_local.order = 0x8c41;
  }
  else if (local_14.type == 0xf0003) {
    texFormat_local.order = 0x8c43;
  }
  else if (local_14.type == 0x120004) {
    texFormat_local.order = 0x81a5;
  }
  else if (local_14.type == 0x120019) {
    texFormat_local.order = 0x81a6;
  }
  else if (local_14.type == 0x120021) {
    texFormat_local.order = 0x81a7;
  }
  else if (local_14.type == 0x120023) {
    texFormat_local.order = 0x8cac;
  }
  else if (local_14.type == 0x13001e) {
    texFormat_local.order = 0x8d48;
  }
  else if (local_14.type == 0x140019) {
    texFormat_local.order = 0x88f0;
  }
  else {
    if (local_14.type != 0x140025) {
      local_14 = texFormat;
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Can\'t map texture format to GL internal format",&local_39);
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    texFormat_local.order = 0x8cad;
  }
  return texFormat_local.order;
}

Assistant:

deUint32 getInternalFormat (tcu::TextureFormat texFormat)
{
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELORDER_LAST < (1<<16));
	DE_STATIC_ASSERT(tcu::TextureFormat::CHANNELTYPE_LAST < (1<<16));

#define PACK_FMT(ORDER, TYPE) ((int(ORDER) << 16) | int(TYPE))
#define FMT_CASE(ORDER, TYPE) PACK_FMT(tcu::TextureFormat::ORDER, tcu::TextureFormat::TYPE)

	switch (PACK_FMT(texFormat.order, texFormat.type))
	{
		case FMT_CASE(RGBA,		UNORM_SHORT_5551):				return GL_RGB5_A1;
		case FMT_CASE(RGBA,		UNORM_SHORT_4444):				return GL_RGBA4;
		case FMT_CASE(RGB,		UNORM_SHORT_565):				return GL_RGB565;
		case FMT_CASE(D,		UNORM_INT16):					return GL_DEPTH_COMPONENT16;
		case FMT_CASE(S,		UNSIGNED_INT8):					return GL_STENCIL_INDEX8;

		case FMT_CASE(RGBA,		FLOAT):							return GL_RGBA32F;
		case FMT_CASE(RGBA,		SIGNED_INT32):					return GL_RGBA32I;
		case FMT_CASE(RGBA,		UNSIGNED_INT32):				return GL_RGBA32UI;
		case FMT_CASE(RGBA,		UNORM_INT16):					return GL_RGBA16;
		case FMT_CASE(RGBA,		SNORM_INT16):					return GL_RGBA16_SNORM;
		case FMT_CASE(RGBA,		HALF_FLOAT):					return GL_RGBA16F;
		case FMT_CASE(RGBA,		SIGNED_INT16):					return GL_RGBA16I;
		case FMT_CASE(RGBA,		UNSIGNED_INT16):				return GL_RGBA16UI;
		case FMT_CASE(RGBA,		UNORM_INT8):					return GL_RGBA8;
		case FMT_CASE(RGBA,		SIGNED_INT8):					return GL_RGBA8I;
		case FMT_CASE(RGBA,		UNSIGNED_INT8):					return GL_RGBA8UI;
		case FMT_CASE(sRGBA,	UNORM_INT8):					return GL_SRGB8_ALPHA8;
		case FMT_CASE(RGBA,		UNORM_INT_1010102_REV):			return GL_RGB10_A2;
		case FMT_CASE(RGBA,		UNSIGNED_INT_1010102_REV):		return GL_RGB10_A2UI;
		case FMT_CASE(RGBA,		SNORM_INT8):					return GL_RGBA8_SNORM;

		case FMT_CASE(RGB,		UNORM_INT8):					return GL_RGB8;
		case FMT_CASE(RGB,		UNSIGNED_INT_11F_11F_10F_REV):	return GL_R11F_G11F_B10F;
		case FMT_CASE(RGB,		FLOAT):							return GL_RGB32F;
		case FMT_CASE(RGB,		SIGNED_INT32):					return GL_RGB32I;
		case FMT_CASE(RGB,		UNSIGNED_INT32):				return GL_RGB32UI;
		case FMT_CASE(RGB,		UNORM_INT16):					return GL_RGB16;
		case FMT_CASE(RGB,		SNORM_INT16):					return GL_RGB16_SNORM;
		case FMT_CASE(RGB,		HALF_FLOAT):					return GL_RGB16F;
		case FMT_CASE(RGB,		SIGNED_INT16):					return GL_RGB16I;
		case FMT_CASE(RGB,		UNSIGNED_INT16):				return GL_RGB16UI;
		case FMT_CASE(RGB,		SNORM_INT8):					return GL_RGB8_SNORM;
		case FMT_CASE(RGB,		SIGNED_INT8):					return GL_RGB8I;
		case FMT_CASE(RGB,		UNSIGNED_INT8):					return GL_RGB8UI;
		case FMT_CASE(sRGB,		UNORM_INT8):					return GL_SRGB8;
		case FMT_CASE(RGB,		UNSIGNED_INT_999_E5_REV):		return GL_RGB9_E5;
		case FMT_CASE(RGB,		UNORM_INT_1010102_REV):			return GL_RGB10;

		case FMT_CASE(RG,		FLOAT):							return GL_RG32F;
		case FMT_CASE(RG,		SIGNED_INT32):					return GL_RG32I;
		case FMT_CASE(RG,		UNSIGNED_INT32):				return GL_RG32UI;
		case FMT_CASE(RG,		UNORM_INT16):					return GL_RG16;
		case FMT_CASE(RG,		SNORM_INT16):					return GL_RG16_SNORM;
		case FMT_CASE(RG,		HALF_FLOAT):					return GL_RG16F;
		case FMT_CASE(RG,		SIGNED_INT16):					return GL_RG16I;
		case FMT_CASE(RG,		UNSIGNED_INT16):				return GL_RG16UI;
		case FMT_CASE(RG,		UNORM_INT8):					return GL_RG8;
		case FMT_CASE(RG,		SIGNED_INT8):					return GL_RG8I;
		case FMT_CASE(RG,		UNSIGNED_INT8):					return GL_RG8UI;
		case FMT_CASE(RG,		SNORM_INT8):					return GL_RG8_SNORM;
		case FMT_CASE(sRG,		UNORM_INT8):					return GL_SRG8_EXT;

		case FMT_CASE(R,		FLOAT):							return GL_R32F;
		case FMT_CASE(R,		SIGNED_INT32):					return GL_R32I;
		case FMT_CASE(R,		UNSIGNED_INT32):				return GL_R32UI;
		case FMT_CASE(R,		UNORM_INT16):					return GL_R16;
		case FMT_CASE(R,		SNORM_INT16):					return GL_R16_SNORM;
		case FMT_CASE(R,		HALF_FLOAT):					return GL_R16F;
		case FMT_CASE(R,		SIGNED_INT16):					return GL_R16I;
		case FMT_CASE(R,		UNSIGNED_INT16):				return GL_R16UI;
		case FMT_CASE(R,		UNORM_INT8):					return GL_R8;
		case FMT_CASE(R,		SIGNED_INT8):					return GL_R8I;
		case FMT_CASE(R,		UNSIGNED_INT8):					return GL_R8UI;
		case FMT_CASE(R,		SNORM_INT8):					return GL_R8_SNORM;
		case FMT_CASE(sR,		UNORM_INT8):					return GL_SR8_EXT;

		case FMT_CASE(D,		FLOAT):							return GL_DEPTH_COMPONENT32F;
		case FMT_CASE(D,		UNSIGNED_INT_24_8):				return GL_DEPTH_COMPONENT24;
		case FMT_CASE(D,		UNSIGNED_INT32):				return GL_DEPTH_COMPONENT32;
		case FMT_CASE(DS,		FLOAT_UNSIGNED_INT_24_8_REV):	return GL_DEPTH32F_STENCIL8;
		case FMT_CASE(DS,		UNSIGNED_INT_24_8):				return GL_DEPTH24_STENCIL8;

		default:
			throw tcu::InternalError("Can't map texture format to GL internal format");
	}
}